

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::SBC_AB(CPU *this)

{
  uint16_t uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  
  this->cycles = 4;
  bVar5 = this->A;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar1);
  uVar4 = (uint)this->A - ((~(uint)(this->field_6).ps & 1) + (uVar2 & 0xff));
  bVar3 = (byte)uVar4;
  this->A = bVar3;
  uVar6 = bVar5 & 0xffffff80;
  bVar5 = ((bVar3 & 0x80) != (byte)uVar6) << 6;
  if ((uVar2 & 0x80) != uVar6) {
    bVar5 = 0;
  }
  (this->field_6).ps =
       (this->field_6).ps & 0x3c | (uVar4 & 0xff00) == 0 | (bVar3 == 0) * '\x02' | bVar5 |
       bVar3 & 0x80;
  return;
}

Assistant:

void CPU::SBC_AB()
{
    cycles = 4;
    uint8_t acp = A, op = ReadByte(GetWord());
    uint16_t sum = A - op - !C;
    A = (sum & 0xFF);
    C = !((sum & 0xFF00) > 0);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}